

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O3

void concept_suite::random_access_iterator_less(void)

{
  bool bVar1;
  initializer_list<int> __l;
  circular_view<int,_18446744073709551615UL> span;
  vector<int,_std::allocator<int>_> data;
  circular_view<int,_18446744073709551615UL> local_78;
  basic_iterator<int> local_50;
  iterator_type local_40;
  vector<int,_std::allocator<int>_> local_30;
  
  local_78.member.data = (pointer)0x160000000b;
  local_78.member.cap = 0x2c00000021;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_78;
  std::vector<int,_std::allocator<int>_>::vector(&local_30,__l,(allocator_type *)&local_50);
  local_78.member.data =
       local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  if ((long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == 0) {
    local_78.member.data = (pointer)0x0;
  }
  local_78.member.cap =
       (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  local_50.current = 0;
  local_40.current = 0;
  local_78.member.size = local_78.member.cap;
  local_78.member.next = local_78.member.cap;
  local_50.parent = &local_78;
  local_40.parent = &local_78;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_50,&local_40);
  boost::detail::test_impl
            ("!(span.begin() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0xec,"void concept_suite::random_access_iterator_less()",!bVar1);
  local_40.current = local_78.member.cap * 2;
  if ((local_40.current & local_78.member.cap * 2 - 1) == 0) {
    local_50.current = local_78.member.next - local_78.member.size & local_40.current - 1;
    local_40.current = local_40.current - 1 & local_78.member.next;
  }
  else {
    local_50.current = (local_78.member.next - local_78.member.size) % local_40.current;
    local_40.current = local_78.member.next % local_40.current;
  }
  local_50.parent = &local_78;
  local_40.parent = &local_78;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_50,&local_40);
  boost::detail::test_impl
            ("span.begin() < span.end()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0xed,"void concept_suite::random_access_iterator_less()",bVar1);
  local_40.current = local_78.member.cap * 2;
  if ((local_40.current & local_78.member.cap * 2 - 1) == 0) {
    local_50.current = local_40.current - 1 & local_78.member.next;
    local_40.current = local_78.member.next - local_78.member.size & local_40.current - 1;
  }
  else {
    local_50.current = local_78.member.next % local_40.current;
    local_40.current = (local_78.member.next - local_78.member.size) % local_40.current;
  }
  local_50.parent = &local_78;
  local_40.parent = &local_78;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_50,&local_40);
  boost::detail::test_impl
            ("!(span.end() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0xee,"void concept_suite::random_access_iterator_less()",!bVar1);
  local_50.current = local_78.member.cap * 2;
  if ((local_50.current & local_78.member.cap * 2 - 1) == 0) {
    local_50.current = local_50.current - 1 & local_78.member.next;
  }
  else {
    local_50.current = local_78.member.next % local_50.current;
  }
  local_50.parent = &local_78;
  local_40.parent = &local_78;
  local_40.current = local_50.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_50,&local_40);
  boost::detail::test_impl
            ("!(span.end() < span.end())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0xef,"void concept_suite::random_access_iterator_less()",!bVar1);
  if (local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void random_access_iterator_less()
{
    // a < b
    std::vector<int> data = { 11, 22, 33, 44 };
    circular_view<int> span(data.begin(), data.end(), data.begin(), data.size());
    BOOST_TEST(!(span.begin() < span.begin()));
    BOOST_TEST(span.begin() < span.end());
    BOOST_TEST(!(span.end() < span.begin()));
    BOOST_TEST(!(span.end() < span.end()));
}